

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void ext_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  ulong in_RAX;
  uint8_t default_size;
  cs_m680x_op *op;
  uint16_t imm16;
  undefined8 uStack_28;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  uStack_28 = in_RAX & 0xffffffffffff;
  indexed12_hdlr(MI,info,address);
  read_word(info,(uint16_t *)((long)&uStack_28 + 6),*address);
  op->type = M680X_OP_EXTENDED;
  (info->m680x).operands[bVar1].field_1.rel.address = uStack_28._6_2_;
  set_operand_size(info,op,default_size);
  return;
}

Assistant:

static void ext_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op0 = &m680x->operands[m680x->op_count++];
	uint16_t imm16 = 0;

	indexed12_hdlr(MI, info, address);
	read_word(info, &imm16, *address);
	op0->type = M680X_OP_EXTENDED;
	op0->ext.address = (int16_t)imm16;
	set_operand_size(info, op0, 1);
}